

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactTriangleXYZROT::IsSubBlockActive(ChContactTriangleXYZROT *this)

{
  int in_ESI;
  
  IsSubBlockActive((ChContactTriangleXYZROT *)
                   ((long)&(this->super_ChContactable_3vars<6,_6,_6>).super_ChContactable.
                           _vptr_ChContactable +
                   (long)(this->super_ChContactable_3vars<6,_6,_6>).super_ChContactable.
                         _vptr_ChContactable[-0xd]),in_ESI);
  return;
}

Assistant:

bool ChContactTriangleXYZROT::IsSubBlockActive(int nblock) const {
    if (nblock == 0)
        return !GetNode1()->GetFixed();
    if (nblock == 1)
        return !GetNode2()->GetFixed();
    if (nblock == 2)
        return !GetNode3()->GetFixed();

    return false;
}